

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

int compare_func(void *a,void *b)

{
  undefined8 local_48;
  pair *bb;
  pair *aa;
  void *b_local;
  void *a_local;
  
  if (*(long *)((long)a + 8) == 0) {
    a_local._4_4_ = -1;
  }
  else if (*(long *)((long)b + 8) == 0) {
    a_local._4_4_ = 1;
  }
  else {
    if (*(ulong *)((long)a + 8) < *(ulong *)((long)b + 8)) {
      local_48 = *(size_t *)((long)a + 8);
    }
    else {
      local_48 = *(size_t *)((long)b + 8);
    }
    a_local._4_4_ = strncmp(*a,*b,local_48);
  }
  return a_local._4_4_;
}

Assistant:

static int compare_func(const void *a, const void *b)
{
  const struct pair *aa = a;
  const struct pair *bb = b;
  /* If one element is empty, the other is always sorted higher */
  if(aa->len == 0)
    return -1;
  if(bb->len == 0)
    return 1;
  return strncmp(aa->p, bb->p, aa->len < bb->len ? aa->len : bb->len);
}